

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_x509a.cc
# Opt level: O1

int X509_CERT_AUX_print(BIO *bp,X509_CERT_AUX *x,int indent)

{
  ASN1_UTF8STRING *pAVar1;
  size_t sVar2;
  ASN1_OBJECT *pAVar3;
  size_t sVar4;
  ASN1_OCTET_STRING *pAVar5;
  bool bVar6;
  char *pcVar7;
  long lVar8;
  char oidstr [80];
  char acStack_88 [88];
  
  if (x != (X509_CERT_AUX *)0x0) {
    if (x->trust == (stack_st_ASN1_OBJECT *)0x0) {
      BIO_printf(bp,"%*sNo Trusted Uses.\n",(ulong)(uint)indent,"");
    }
    else {
      BIO_printf(bp,"%*sTrusted Uses:\n%*s",(ulong)(uint)indent,"",(ulong)(indent + 2),"");
      sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)x->trust);
      if (sVar2 != 0) {
        sVar2 = 0;
        bVar6 = false;
        do {
          if (bVar6) {
            BIO_puts(bp,", ");
          }
          pAVar3 = (ASN1_OBJECT *)OPENSSL_sk_value((OPENSSL_STACK *)x->trust,sVar2);
          OBJ_obj2txt(acStack_88,0x50,pAVar3,0);
          BIO_puts(bp,acStack_88);
          sVar2 = sVar2 + 1;
          sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)x->trust);
          bVar6 = true;
        } while (sVar2 < sVar4);
      }
      BIO_puts(bp,"\n");
    }
    if (x->reject == (stack_st_ASN1_OBJECT *)0x0) {
      BIO_printf(bp,"%*sNo Rejected Uses.\n",(ulong)(uint)indent,"");
    }
    else {
      BIO_printf(bp,"%*sRejected Uses:\n%*s",(ulong)(uint)indent,"",(ulong)(indent + 2),"");
      sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)x->reject);
      if (sVar2 != 0) {
        sVar2 = 0;
        bVar6 = false;
        do {
          if (bVar6) {
            BIO_puts(bp,", ");
          }
          pAVar3 = (ASN1_OBJECT *)OPENSSL_sk_value((OPENSSL_STACK *)x->reject,sVar2);
          OBJ_obj2txt(acStack_88,0x50,pAVar3,0);
          BIO_puts(bp,acStack_88);
          sVar2 = sVar2 + 1;
          sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)x->reject);
          bVar6 = true;
        } while (sVar2 < sVar4);
      }
      BIO_puts(bp,"\n");
    }
    pAVar1 = x->alias;
    if (pAVar1 != (ASN1_UTF8STRING *)0x0) {
      BIO_printf(bp,"%*sAlias: %.*s\n",(ulong)(uint)indent,"",(ulong)(uint)pAVar1->length,
                 pAVar1->data);
    }
    if (x->keyid != (ASN1_OCTET_STRING *)0x0) {
      BIO_printf(bp,"%*sKey Id: ",(ulong)(uint)indent,"");
      pAVar5 = x->keyid;
      if (0 < pAVar5->length) {
        lVar8 = 0;
        do {
          pcVar7 = ":";
          if (lVar8 == 0) {
            pcVar7 = "";
          }
          BIO_printf(bp,"%s%02X",pcVar7,(ulong)pAVar5->data[lVar8]);
          lVar8 = lVar8 + 1;
          pAVar5 = x->keyid;
        } while (lVar8 < pAVar5->length);
      }
      BIO_write(bp,"\n",1);
    }
  }
  return 1;
}

Assistant:

int X509_CERT_AUX_print(BIO *out, X509_CERT_AUX *aux, int indent) {
  char oidstr[80], first;
  size_t i;
  int j;
  if (!aux) {
    return 1;
  }
  if (aux->trust) {
    first = 1;
    BIO_printf(out, "%*sTrusted Uses:\n%*s", indent, "", indent + 2, "");
    for (i = 0; i < sk_ASN1_OBJECT_num(aux->trust); i++) {
      if (!first) {
        BIO_puts(out, ", ");
      } else {
        first = 0;
      }
      OBJ_obj2txt(oidstr, sizeof oidstr, sk_ASN1_OBJECT_value(aux->trust, i),
                  0);
      BIO_puts(out, oidstr);
    }
    BIO_puts(out, "\n");
  } else {
    BIO_printf(out, "%*sNo Trusted Uses.\n", indent, "");
  }
  if (aux->reject) {
    first = 1;
    BIO_printf(out, "%*sRejected Uses:\n%*s", indent, "", indent + 2, "");
    for (i = 0; i < sk_ASN1_OBJECT_num(aux->reject); i++) {
      if (!first) {
        BIO_puts(out, ", ");
      } else {
        first = 0;
      }
      OBJ_obj2txt(oidstr, sizeof oidstr, sk_ASN1_OBJECT_value(aux->reject, i),
                  0);
      BIO_puts(out, oidstr);
    }
    BIO_puts(out, "\n");
  } else {
    BIO_printf(out, "%*sNo Rejected Uses.\n", indent, "");
  }
  if (aux->alias) {
    BIO_printf(out, "%*sAlias: %.*s\n", indent, "", aux->alias->length,
               aux->alias->data);
  }
  if (aux->keyid) {
    BIO_printf(out, "%*sKey Id: ", indent, "");
    for (j = 0; j < aux->keyid->length; j++) {
      BIO_printf(out, "%s%02X", j ? ":" : "", aux->keyid->data[j]);
    }
    BIO_write(out, "\n", 1);
  }
  return 1;
}